

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

char * sx_os_path_basename(char *dst,int size,char *path)

{
  char *local_28;
  char *r;
  char *path_local;
  int size_local;
  char *dst_local;
  
  local_28 = sx_strrchar(path,'/');
  if (local_28 == (char *)0x0) {
    local_28 = sx_strrchar(path,'\\');
  }
  if (local_28 == (char *)0x0) {
    if (dst != path) {
      sx_strcpy(dst,size,path);
    }
  }
  else {
    sx_strcpy(dst,size,local_28 + 1);
  }
  return dst;
}

Assistant:

char* sx_os_path_basename(char* dst, int size, const char* path)
{
    const char* r = sx_strrchar(path, '/');
    if (!r)
        r = sx_strrchar(path, '\\');
    if (r) {
        sx_strcpy(dst, size, r + 1);
    } else if (dst != path) {
        sx_strcpy(dst, size, path);
    }
    return dst;
}